

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int emit_push_const(JSParseState *s,JSValue val,BOOL as_atom)

{
  JSFunctionDef *pJVar1;
  JSAtom JVar2;
  JSValueUnion p_00;
  JSAtom *data;
  JSRefCountHeader *p;
  JSValue val_00;
  JSAtom local_28;
  JSAtom local_24;
  
  p_00 = val.u;
  data = &local_28;
  if (as_atom != 0 && (uint)val.tag == 0xfffffff9) {
    *(int *)p_00.ptr = *p_00.ptr + 1;
    JVar2 = JS_NewAtomStr((JSContext *)s->ctx->rt,(JSString *)p_00.ptr);
    if (0 < (int)JVar2) {
      emit_op(s,'\x04');
      pJVar1 = s->cur_func;
      goto LAB_00158b04;
    }
  }
  if (0xfffffff4 < (uint)val.tag) {
    *(int *)p_00.ptr = *p_00.ptr + 1;
  }
  val_00.tag = (int64_t)p_00.ptr;
  val_00.u = (JSValueUnion)(JSValueUnion)s->cur_func;
  JVar2 = cpool_add((JSParseState *)s->ctx,val_00);
  if ((int)JVar2 < 0) {
    return -1;
  }
  emit_op(s,'\x02');
  pJVar1 = s->cur_func;
  data = &local_24;
LAB_00158b04:
  *data = JVar2;
  dbuf_put(&pJVar1->byte_code,(uint8_t *)data,4);
  return 0;
}

Assistant:

static __exception int emit_push_const(JSParseState *s, JSValueConst val,
                                       BOOL as_atom)
{
    int idx;

    if (JS_VALUE_GET_TAG(val) == JS_TAG_STRING && as_atom) {
        JSAtom atom;
        /* warning: JS_NewAtomStr frees the string value */
        JS_DupValue(s->ctx, val);
        atom = JS_NewAtomStr(s->ctx, JS_VALUE_GET_STRING(val));
        if (atom != JS_ATOM_NULL && !__JS_AtomIsTaggedInt(atom)) {
            emit_op(s, OP_push_atom_value);
            emit_u32(s, atom);
            return 0;
        }
    }

    idx = cpool_add(s, JS_DupValue(s->ctx, val));
    if (idx < 0)
        return -1;
    emit_op(s, OP_push_const);
    emit_u32(s, idx);
    return 0;
}